

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

boolean dig_check(monst *madeby,boolean verbose,int x,int y)

{
  boolean bVar1;
  int iVar2;
  trap *ptVar3;
  char *pcVar4;
  char *pcVar5;
  obj *poVar6;
  bool bVar7;
  char *verb;
  trap *ttmp;
  int y_local;
  int x_local;
  boolean verbose_local;
  monst *madeby_local;
  
  ptVar3 = t_at(level,x,y);
  bVar7 = false;
  if (((madeby == &youmonst) && (bVar7 = false, uwep != (obj *)0x0)) &&
     ((uwep->oclass == '\x02' || (bVar7 = false, uwep->oclass == '\x06')))) {
    bVar7 = objects[uwep->otyp].oc_subtyp == '\x03';
  }
  pcVar4 = "dig in";
  if (bVar7) {
    pcVar4 = "chop";
  }
  bVar1 = On_stairs((xchar)x,(xchar)y);
  if (bVar1 == '\0') {
    if ((level->locations[x][y].typ == '\x17') && (iVar2 = artifact_door(level,x,y), iVar2 != 0)) {
      if (verbose != '\0') {
        pcVar4 = surface(x,y);
        pline("The %s here is too hard to dig in.",pcVar4);
      }
      madeby_local._7_1_ = '\0';
    }
    else if ((level->locations[x][y].typ == '\x1d') && (madeby != (monst *)0x0)) {
      if (verbose != '\0') {
        pline("The throne is too hard to break apart.");
      }
      madeby_local._7_1_ = '\0';
    }
    else if ((level->locations[x][y].typ == '!') &&
            (((madeby != (monst *)0x0 ||
              (bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level), bVar1 != '\0')) ||
             (bVar1 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar1 != '\0')))) {
      if (verbose != '\0') {
        pline("The altar is too hard to break apart.");
      }
      madeby_local._7_1_ = '\0';
    }
    else {
      bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (bVar1 == '\0') {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
        if (bVar1 == '\0') {
          if ((((level->locations[x][y].typ < '\x11') && (level->locations[x][y].typ != '\x0f')) &&
              ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 8) != 0)) ||
             ((ptVar3 != (trap *)0x0 &&
              ((((ptVar3->field_0x8 & 0x1f) == 0x12 || ((ptVar3->field_0x8 & 0x1f) == 0xf)) ||
               (bVar1 = can_dig_down(level), bVar1 == '\0')))))) {
            if (verbose != '\0') {
              pcVar5 = surface(x,y);
              pline("The %s here is too hard to %s.",pcVar5,pcVar4);
            }
            madeby_local._7_1_ = '\0';
          }
          else {
            poVar6 = sobj_at(0x214,level,x,y);
            if (poVar6 == (obj *)0x0) {
              if ((madeby == (monst *)0x0) &&
                 (((ptVar3 != (trap *)0x0 || (bVar1 = is_pool(level,x,y), bVar1 != '\0')) ||
                  (bVar1 = is_lava(level,x,y), bVar1 != '\0')))) {
                madeby_local._7_1_ = '\0';
              }
              else {
                madeby_local._7_1_ = '\x01';
              }
            }
            else {
              if (verbose != '\0') {
                pline("There isn\'t enough room to %s here.",pcVar4);
              }
              madeby_local._7_1_ = '\0';
            }
          }
        }
        else {
          if (verbose != '\0') {
            pline("The water splashes and subsides.");
          }
          madeby_local._7_1_ = '\0';
        }
      }
      else {
        if (verbose != '\0') {
          pline("You cannot %s thin air.",pcVar4);
        }
        madeby_local._7_1_ = '\0';
      }
    }
  }
  else {
    if ((x == (level->dnladder).sx) || (x == (level->upladder).sx)) {
      if (verbose != '\0') {
        pline("The ladder resists your effort.");
      }
    }
    else if (verbose != '\0') {
      pline("The stairs are too hard to %s.",pcVar4);
    }
    madeby_local._7_1_ = '\0';
  }
  return madeby_local._7_1_;
}

Assistant:

boolean dig_check(struct monst *madeby, boolean verbose, int x, int y)
{
	struct trap *ttmp = t_at(level, x, y);
	const char *verb = (madeby == BY_YOU && uwep && is_axe(uwep)) ? "chop" : "dig in";

	if (On_stairs(x, y)) {
	    if (x == level->dnladder.sx || x == level->upladder.sx) {
		if (verbose) pline("The ladder resists your effort.");
	    } else if (verbose) pline("The stairs are too hard to %s.", verb);
	    return FALSE;
	/* ALI - Artifact doors */
	} else if (IS_DOOR(level->locations[x][y].typ) && artifact_door(level, x, y)) {
	    if (verbose) pline("The %s here is too hard to dig in.", surface(x,y));
	    return FALSE;
	} else if (IS_THRONE(level->locations[x][y].typ) && madeby != BY_OBJECT) {
	    if (verbose) pline("The throne is too hard to break apart.");
	    return FALSE;
	} else if (IS_ALTAR(level->locations[x][y].typ) && (madeby != BY_OBJECT ||
				Is_astralevel(&u.uz) || Is_sanctum(&u.uz))) {
	    if (verbose) pline("The altar is too hard to break apart.");
	    return FALSE;
	} else if (Is_airlevel(&u.uz)) {
	    if (verbose) pline("You cannot %s thin air.", verb);
	    return FALSE;
	} else if (Is_waterlevel(&u.uz)) {
	    if (verbose) pline("The water splashes and subsides.");
	    return FALSE;
	} else if ((IS_ROCK(level->locations[x][y].typ) && level->locations[x][y].typ != SDOOR &&
		      (level->locations[x][y].wall_info & W_NONDIGGABLE) != 0)
		|| (ttmp &&
		      (ttmp->ttyp == MAGIC_PORTAL ||
                       ttmp->ttyp == VIBRATING_SQUARE ||
                       !can_dig_down(level)))) {
	    if (verbose) pline("The %s here is too hard to %s.",
				  surface(x,y), verb);
	    return FALSE;
	} else if (sobj_at(BOULDER, level, x, y)) {
	    if (verbose) pline("There isn't enough room to %s here.", verb);
	    return FALSE;
	} else if (madeby == BY_OBJECT &&
		    /* the block against existing traps is mainly to
		       prevent broken wands from turning holes into pits */
		    (ttmp || is_pool(level, x,y) || is_lava(level, x,y))) {
	    /* digging by player handles pools separately */
	    return FALSE;
	}
	return TRUE;
}